

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netmessagemaker.h
# Opt level: O0

CSerializedNetMsg *
NetMsg::Make<BlockTransactionsRequest&>(string *msg_type,BlockTransactionsRequest *args)

{
  size_t in_RSI;
  BlockTransactionsRequest *in_RDI;
  long in_FS_OFFSET;
  CSerializedNetMsg *msg;
  CSerializedNetMsg *in_stack_ffffffffffffff98;
  BlockTransactionsRequest *vchDataIn;
  VectorWriter *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  
  this = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
          (in_FS_OFFSET + 0x28);
  vchDataIn = in_RDI;
  CSerializedNetMsg::CSerializedNetMsg(in_stack_ffffffffffffff98);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (this,in_stack_fffffffffffffff0);
  VectorWriter::VectorWriter<BlockTransactionsRequest&>
            (in_stack_ffffffffffffffb8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)vchDataIn,in_RSI,in_RDI);
  if (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_FS_OFFSET + 0x28)
      != this) {
    __stack_chk_fail();
  }
  return (CSerializedNetMsg *)in_RDI;
}

Assistant:

CSerializedNetMsg Make(std::string msg_type, Args&&... args)
    {
        CSerializedNetMsg msg;
        msg.m_type = std::move(msg_type);
        VectorWriter{msg.data, 0, std::forward<Args>(args)...};
        return msg;
    }